

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall sglr::GLContext::deleteBuffers(GLContext *this,int numBuffers,deUint32 *buffers)

{
  int local_24;
  int i;
  deUint32 *buffers_local;
  int numBuffers_local;
  GLContext *this_local;
  
  glu::CallLogWrapper::glDeleteBuffers(this->m_wrapper,numBuffers,buffers);
  for (local_24 = 0; local_24 < numBuffers; local_24 = local_24 + 1) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
              (&this->m_allocatedBuffers,buffers + local_24);
  }
  return;
}

Assistant:

void GLContext::deleteBuffers (int numBuffers, const deUint32* buffers)
{
	m_wrapper->glDeleteBuffers(numBuffers, buffers);
	for (int i = 0; i < numBuffers; i++)
		m_allocatedBuffers.erase(buffers[i]);
}